

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddCustomCommandOldStyle
          (cmMakefile *this,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *depends,string *source,cmCustomCommandLines *commandLines,char *comment)

{
  pointer pbVar1;
  char *__s;
  __type _Var2;
  bool bVar3;
  cmSourceFile *this_00;
  iterator iVar4;
  string *src;
  pointer pbVar5;
  allocator<char> local_1db;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  string *local_1d8;
  cmCustomCommandLines *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c8;
  string *local_1c0;
  string no_main_dependency;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends2;
  string local_138;
  string local_118;
  RegularExpression sourceFiles;
  
  local_1d8 = target;
  local_1d0 = commandLines;
  local_1c8 = depends;
  local_1c0 = source;
  _Var2 = std::operator==(source,target);
  if (_Var2) {
    no_byproducts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    no_byproducts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    no_byproducts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sourceFiles,"",(allocator<char> *)&local_118);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&no_main_dependency,"",(allocator<char> *)&local_138);
    AddCustomCommandToTarget
              (this,local_1d8,&no_byproducts,local_1c8,local_1d0,POST_BUILD,comment,(char *)0x0,true
               ,false,(string *)&sourceFiles,&no_main_dependency,false,RejectObjectLibraryCommands);
    std::__cxx11::string::~string((string *)&no_main_dependency);
    std::__cxx11::string::~string((string *)&sourceFiles);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&no_byproducts);
  }
  else {
    cmsys::RegularExpression::RegularExpression
              (&sourceFiles,
               "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|cu|m|mm|rc|def|r|odl|idl|hpj|bat|h|h\\+\\+|hm|hpp|hxx|in|txx|inl)$"
              );
    pbVar1 = (outputs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = (outputs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1)
    {
      __s = (pbVar5->_M_dataplus)._M_p;
      bVar3 = cmsys::RegularExpression::find(&sourceFiles,local_1c0);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&no_main_dependency,__s,(allocator<char> *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&no_byproducts,"",(allocator<char> *)&depends2);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_1db);
        this_00 = AddCustomCommandToOutput
                            (this,&no_main_dependency,local_1c8,local_1c0,local_1d0,comment,
                             (char *)0x0,false,true,false,false,(string *)&no_byproducts,&local_118)
        ;
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&no_byproducts);
      }
      else {
        no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
        no_main_dependency._M_string_length = 0;
        no_main_dependency.field_2._M_local_buf[0] = '\0';
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&depends2,local_1c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends2,local_1c0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&no_byproducts,__s,&local_1db);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_1d9);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_1da);
        this_00 = AddCustomCommandToOutput
                            (this,(string *)&no_byproducts,&depends2,&no_main_dependency,local_1d0,
                             comment,(char *)0x0,false,true,false,false,&local_118,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&no_byproducts);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&depends2);
      }
      std::__cxx11::string::~string((string *)&no_main_dependency);
      if (this_00 != (cmSourceFile *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&no_main_dependency,"__CMAKE_RULE",(allocator<char> *)&no_byproducts);
        bVar3 = cmSourceFile::GetPropertyAsBool(this_00,&no_main_dependency);
        std::__cxx11::string::~string((string *)&no_main_dependency);
        if (!bVar3) {
          iVar4 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(this->Targets)._M_h,local_1d8);
          if (iVar4.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::operator+(&no_main_dependency,
                           "Attempt to add a custom rule to a target that does not exist yet for target "
                           ,local_1d8);
            cmSystemTools::Error(&no_main_dependency);
            std::__cxx11::string::~string((string *)&no_main_dependency);
            break;
          }
          src = cmSourceFile::GetFullPath(this_00,(string *)0x0);
          cmTarget::AddSource((cmTarget *)
                              ((long)iVar4.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                     ._M_cur + 0x28),src,false);
        }
      }
    }
    cmsys::RegularExpression::~RegularExpression(&sourceFiles);
  }
  return;
}

Assistant:

void cmMakefile::AddCustomCommandOldStyle(
  const std::string& target, const std::vector<std::string>& outputs,
  const std::vector<std::string>& depends, const std::string& source,
  const cmCustomCommandLines& commandLines, const char* comment)
{
  // Translate the old-style signature to one of the new-style
  // signatures.
  if (source == target) {
    // In the old-style signature if the source and target were the
    // same then it added a post-build rule to the target.  Preserve
    // this behavior.
    std::vector<std::string> no_byproducts;
    this->AddCustomCommandToTarget(target, no_byproducts, depends,
                                   commandLines, cmTarget::POST_BUILD, comment,
                                   nullptr);
    return;
  }

  // Each output must get its own copy of this rule.
  cmsys::RegularExpression sourceFiles("\\.(C|M|c|c\\+\\+|cc|cpp|cxx|cu|m|mm|"
                                       "rc|def|r|odl|idl|hpj|bat|h|h\\+\\+|"
                                       "hm|hpp|hxx|in|txx|inl)$");
  for (std::string const& oi : outputs) {
    // Get the name of this output.
    const char* output = oi.c_str();
    cmSourceFile* sf;

    // Choose whether to use a main dependency.
    if (sourceFiles.find(source)) {
      // The source looks like a real file.  Use it as the main dependency.
      sf = this->AddCustomCommandToOutput(output, depends, source,
                                          commandLines, comment, nullptr);
    } else {
      // The source may not be a real file.  Do not use a main dependency.
      std::string no_main_dependency;
      std::vector<std::string> depends2 = depends;
      depends2.push_back(source);
      sf = this->AddCustomCommandToOutput(output, depends2, no_main_dependency,
                                          commandLines, comment, nullptr);
    }

    // If the rule was added to the source (and not a .rule file),
    // then add the source to the target to make sure the rule is
    // included.
    if (sf && !sf->GetPropertyAsBool("__CMAKE_RULE")) {
      cmTargetMap::iterator ti = this->Targets.find(target);
      if (ti != this->Targets.end()) {
        ti->second.AddSource(sf->GetFullPath());
      } else {
        cmSystemTools::Error("Attempt to add a custom rule to a target "
                             "that does not exist yet for target " +
                             target);
        return;
      }
    }
  }
}